

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O0

void __thiscall
google::protobuf::util::MessageDifferencer::StreamReporter::ReportMoved
          (StreamReporter *this,Message *message1,Message *param_2,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *field_path)

{
  Printer *pPVar1;
  string_view local_68;
  string_view local_58;
  string_view local_48;
  string_view local_38;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *local_28;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *field_path_local;
  Message *param_2_local;
  Message *message1_local;
  StreamReporter *this_local;
  
  pPVar1 = this->printer_;
  local_28 = field_path;
  field_path_local =
       (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
        *)param_2;
  param_2_local = message1;
  message1_local = (Message *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"moved: ");
  io::Printer::Print<>(pPVar1,local_38);
  (*(this->super_Reporter)._vptr_Reporter[9])(this,local_28,1);
  pPVar1 = this->printer_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48," -> ");
  io::Printer::Print<>(pPVar1,local_48);
  (*(this->super_Reporter)._vptr_Reporter[9])(this,local_28,0);
  pPVar1 = this->printer_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58," : ");
  io::Printer::Print<>(pPVar1,local_58);
  (*(this->super_Reporter)._vptr_Reporter[10])(this,param_2_local,local_28,1);
  pPVar1 = this->printer_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"\n");
  io::Printer::Print<>(pPVar1,local_68);
  return;
}

Assistant:

void MessageDifferencer::StreamReporter::ReportMoved(
    const Message& message1, const Message& /*message2*/,
    const std::vector<SpecificField>& field_path) {
  printer_->Print("moved: ");
  PrintPath(field_path, true);
  printer_->Print(" -> ");
  PrintPath(field_path, false);
  printer_->Print(" : ");
  PrintValue(message1, field_path, true);
  printer_->Print("\n");  // Print for newlines.
}